

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  Mem *pVal;
  double dVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  size_t sVar9;
  sqlite3_int64 sVar10;
  sqlite3_int64 sVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  uchar uVar16;
  uchar uVar17;
  uint uVar18;
  ulong uVar19;
  byte *__s;
  char *zDate;
  undefined4 uVar20;
  undefined4 uVar21;
  int M;
  int Y;
  double r;
  int local_ac;
  sqlite3_context *local_a8;
  undefined8 local_a0;
  double local_98;
  sqlite3_value **local_90;
  int local_84;
  double local_80;
  ulong local_78;
  ulong local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar6 = setDateTimeToCurrent(context,p);
    return iVar6;
  }
  pVal = *argv;
  local_a8 = context;
  local_90 = argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
      [pVal->flags & 0x1f] - 1 < 2) {
    dVar3 = sqlite3VdbeRealValue(pVal);
    uVar20 = SUB84(dVar3,0);
    uVar21 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  else {
    pcVar13 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar13 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar13;
    uVar19 = (ulong)(cVar1 == '-');
    iVar6 = getDigits(pcVar13 + uVar19,"40f-21a-21d",&local_a0,&local_ac,&local_84);
    if (iVar6 == 3) {
      zDate = pcVar13 + uVar19 + 9;
      do {
        do {
          pbVar8 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar8 == 0x54);
      } while ((""[*pbVar8] & 1) != 0);
      iVar6 = parseHhMmSs(zDate,p);
      if (iVar6 != 0) {
        context = local_a8;
        if (*zDate != '\0') goto LAB_0019a31d;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar6 = -(int)local_a0;
      if (cVar1 != '-') {
        iVar6 = (int)local_a0;
      }
      p->Y = iVar6;
      p->M = local_ac;
      p->D = local_84;
      argv = local_90;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_90;
      }
      goto LAB_0019a3e0;
    }
LAB_0019a31d:
    iVar6 = parseHhMmSs(pcVar13,p);
    argv = local_90;
    if (iVar6 == 0) goto LAB_0019a3e0;
    iVar6 = sqlite3StrICmp(pcVar13,"now");
    if ((iVar6 == 0) && (iVar6 = sqlite3NotPureFunc(context), iVar6 != 0)) {
      iVar6 = setDateTimeToCurrent(context,p);
      if (iVar6 != 0) {
        return 1;
      }
      goto LAB_0019a3e0;
    }
    sVar9 = strlen(pcVar13);
    iVar6 = sqlite3AtoF(pcVar13,(double *)&local_68,(uint)sVar9 & 0x3fffffff,'\x01');
    if (iVar6 == 0) {
      return 1;
    }
    uVar20 = (undefined4)local_68.iJD;
    uVar21 = (undefined4)((ulong)local_68.iJD >> 0x20);
  }
  p->s = (double)CONCAT44(uVar21,uVar20);
  p->rawS = '\x01';
  if ((0.0 <= (double)CONCAT44(uVar21,uVar20)) &&
     ((double)CONCAT44(uVar21,uVar20) <= 5373484.5 && (double)CONCAT44(uVar21,uVar20) != 5373484.5))
  {
    p->iJD = (long)((double)CONCAT44(uVar21,uVar20) * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
LAB_0019a3e0:
  if (1 < argc) {
    local_78 = (ulong)(uint)argc;
    uVar19 = 1;
    do {
      pbVar8 = (byte *)sqlite3ValueText(argv[uVar19],'\x01');
      sqlite3ValueBytes(argv[uVar19],'\x01');
      if (pbVar8 == (byte *)0x0) {
        return 1;
      }
      local_ac = 1;
      bVar5 = *pbVar8;
      bVar2 = ""[bVar5];
      local_70 = uVar19;
      if (bVar2 < 0x6c) {
        if (((bVar2 - 0x30 < 10) || (bVar2 == 0x2b)) || (bVar2 == 0x2d)) {
          lVar14 = 1;
          __s = pbVar8;
          while( true ) {
            bVar2 = pbVar8[lVar14];
            if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
            lVar14 = lVar14 + 1;
            __s = __s + 1;
          }
          iVar6 = sqlite3AtoF((char *)pbVar8,(double *)&local_a0,(int)lVar14,'\x01');
          if (iVar6 == 0) {
            return 1;
          }
          if (bVar2 == 0x3a) {
            local_68.s = 0.0;
            local_68.validJD = '\0';
            local_68.rawS = '\0';
            local_68.validYMD = '\0';
            local_68.validHMS = '\0';
            local_68.validTZ = '\0';
            local_68.tzSet = '\0';
            local_68.isError = '\0';
            local_68._47_1_ = 0;
            local_68.D = 0;
            local_68.h = 0;
            local_68.m = 0;
            local_68.tz = 0;
            local_68.iJD = 0;
            local_68.Y = 0;
            local_68.M = 0;
            iVar6 = parseHhMmSs((char *)(pbVar8 + ((ulong)bVar5 - 0x3a < 0xfffffffffffffff6)),
                                &local_68);
            argv = local_90;
            if (iVar6 == 0) {
              computeJD(&local_68);
              lVar12 = (local_68.iJD + -43200000) % 86400000;
              lVar14 = -lVar12;
              if (*pbVar8 != 0x2d) {
                lVar14 = lVar12;
              }
              computeJD(p);
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->validTZ = '\0';
              p->iJD = p->iJD + lVar14;
              local_ac = 0;
              argv = local_90;
            }
          }
          else {
            do {
              pbVar8 = __s + 1;
              __s = __s + 1;
            } while ((""[*pbVar8] & 1) != 0);
            sVar9 = strlen((char *)__s);
            argv = local_90;
            uVar18 = (uint)sVar9 & 0x3fffffff;
            if (0xfffffff7 < uVar18 - 0xb) {
              if ((__s[uVar18 - 1] & 0xdf) == 0x53) {
                uVar18 = uVar18 - 1;
              }
              computeJD(p);
              dVar4 = (double)CONCAT44(local_a0._4_4_,(int)local_a0);
              local_ac = 1;
              dVar3 = *(double *)(&DAT_001df180 + (ulong)(dVar4 < 0.0) * 8);
              lVar14 = 0;
              do {
                if (uVar18 == aXformType[lVar14].nName) {
                  if (aXformType[lVar14].zName != (char *)0x0) {
                    lVar12 = 0;
                    uVar15 = uVar18 + 1;
                    do {
                      uVar19 = (ulong)(byte)aXformType[lVar14].zName[lVar12];
                      if (uVar19 == 0) {
                        uVar17 = ""[__s[lVar12]];
                        uVar16 = '\0';
LAB_0019a639:
                        if (uVar16 != uVar17) goto LAB_0019a663;
                        break;
                      }
                      uVar16 = ""[uVar19];
                      uVar17 = ""[__s[lVar12]];
                      if (uVar16 != uVar17) goto LAB_0019a639;
                      uVar15 = uVar15 - 1;
                      lVar12 = lVar12 + 1;
                    } while (1 < uVar15);
                    if ((-aXformType[lVar14].rLimit < dVar4) && (dVar4 < aXformType[lVar14].rLimit))
                    {
                      local_98 = dVar4;
                      local_80 = dVar3;
                      if (aXformType[lVar14].eType == '\x02') {
                        iVar6 = (int)dVar4;
                        computeYMD(p);
                        computeHMS(p);
                        p->Y = p->Y + iVar6;
LAB_0019ab56:
                        p->validJD = '\0';
                        local_98 = local_98 - (double)iVar6;
                      }
                      else if (aXformType[lVar14].eType == '\x01') {
                        computeYMD(p);
                        computeHMS(p);
                        iVar6 = (int)local_98;
                        iVar7 = p->M + iVar6;
                        if (iVar7 == 0 || SCARRY4(p->M,iVar6) != iVar7 < 0) {
                          uVar18 = -((0xcU - iVar7) / 0xc);
                        }
                        else {
                          uVar18 = (iVar7 - 1U) / 0xc;
                        }
                        p->Y = p->Y + uVar18;
                        p->M = iVar7 + uVar18 * -0xc;
                        goto LAB_0019ab56;
                      }
                      computeJD(p);
                      p->iJD = p->iJD + (long)(local_98 * aXformType[lVar14].rXform + local_80);
                      local_ac = 0;
                      break;
                    }
                  }
                }
LAB_0019a663:
                lVar14 = lVar14 + 1;
              } while (lVar14 != 6);
LAB_0019a670:
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->validTZ = '\0';
            }
          }
        }
LAB_0019a67a:
        if (local_ac != 0) {
          return 1;
        }
      }
      else {
        if (bVar2 < 0x75) {
          if (bVar2 == 0x6c) {
            iVar6 = sqlite3StrICmp((char *)pbVar8,"localtime");
            if ((iVar6 == 0) && (iVar6 = sqlite3NotPureFunc(local_a8), iVar6 != 0)) {
              computeJD(p);
              sVar10 = localtimeOffset(p,local_a8,&local_ac);
              p->iJD = p->iJD + sVar10;
              goto LAB_0019a670;
            }
          }
          else if (bVar2 == 0x73) {
            uVar16 = '\0';
            if (bVar5 == 0) {
              pcVar13 = "start of ";
            }
            else {
              lVar14 = 0;
              do {
                lVar12 = lVar14;
                uVar16 = ""[bVar5];
                if (uVar16 != ""[(byte)"start of "[lVar12]]) {
                  pcVar13 = "start of " + lVar12;
                  goto LAB_0019a937;
                }
                if (lVar12 == 8) goto LAB_0019a947;
                bVar5 = pbVar8[lVar12 + 1];
                lVar14 = lVar12 + 1;
              } while (bVar5 != 0);
              pcVar13 = "start of " + lVar12 + 1;
              uVar16 = '\0';
            }
LAB_0019a937:
            if (uVar16 == ""[(byte)*pcVar13]) {
LAB_0019a947:
              if (((p->validJD != '\0') || (p->validYMD != '\0')) || (p->validHMS != '\0')) {
                pbVar8 = pbVar8 + 9;
                computeYMD(p);
                p->validHMS = '\x01';
                p->validTZ = '\0';
                p->h = 0;
                p->m = 0;
                p->s = 0.0;
                p->validJD = '\0';
                p->rawS = '\0';
                iVar6 = sqlite3StrICmp((char *)pbVar8,"month");
                if (iVar6 == 0) {
                  p->D = 1;
                }
                else {
                  iVar6 = sqlite3StrICmp((char *)pbVar8,"year");
                  if (iVar6 == 0) {
                    p->M = 1;
                    p->D = 1;
                  }
                  else {
                    iVar6 = sqlite3StrICmp((char *)pbVar8,"day");
                    if (iVar6 != 0) goto LAB_0019a67a;
                  }
                }
                goto LAB_0019a685;
              }
            }
          }
          goto LAB_0019a67a;
        }
        if (bVar2 != 0x75) {
          if (bVar2 == 0x77) {
            uVar16 = '\0';
            if (bVar5 == 0) {
              pcVar13 = "weekday ";
            }
            else {
              lVar14 = 0;
              do {
                lVar12 = lVar14;
                uVar16 = ""[bVar5];
                if (uVar16 != ""[(byte)"weekday "[lVar12]]) {
                  pcVar13 = "weekday " + lVar12;
                  goto LAB_0019a9d3;
                }
                if (lVar12 == 7) goto LAB_0019a9e3;
                bVar5 = pbVar8[lVar12 + 1];
                lVar14 = lVar12 + 1;
              } while (bVar5 != 0);
              pcVar13 = "weekday " + lVar12 + 1;
              uVar16 = '\0';
            }
LAB_0019a9d3:
            if (uVar16 == ""[(byte)*pcVar13]) {
LAB_0019a9e3:
              sVar9 = strlen((char *)(pbVar8 + 8));
              iVar6 = sqlite3AtoF((char *)(pbVar8 + 8),(double *)&local_a0,(uint)sVar9 & 0x3fffffff,
                                  '\x01');
              if (((iVar6 != 0) &&
                  (dVar3 = (double)CONCAT44(local_a0._4_4_,(int)local_a0), dVar3 < 7.0)) &&
                 (uVar18 = (uint)dVar3, -1 < (int)uVar18)) {
                if ((dVar3 == (double)(int)dVar3) && (!NAN(dVar3) && !NAN((double)(int)dVar3))) {
                  computeYMD(p);
                  computeHMS(p);
                  p->validTZ = '\0';
                  p->validJD = '\0';
                  computeJD(p);
                  lVar14 = (p->iJD + 0x7b98a00) / 86400000;
                  lVar12 = (lVar14 / 7) * -7 + -7 + lVar14;
                  if (lVar14 % 7 <= (long)(ulong)uVar18) {
                    lVar12 = lVar14 % 7;
                  }
                  p->iJD = ((ulong)uVar18 - lVar12) * 86400000 + p->iJD;
                  p->validYMD = '\0';
                  p->validHMS = '\0';
                  p->validTZ = '\0';
                  goto LAB_0019a685;
                }
              }
            }
          }
          goto LAB_0019a67a;
        }
        iVar6 = sqlite3StrICmp((char *)pbVar8,"unixepoch");
        if ((iVar6 != 0) || (p->rawS == '\0')) {
          iVar6 = sqlite3StrICmp((char *)pbVar8,"utc");
          if ((iVar6 == 0) && (iVar6 = sqlite3NotPureFunc(local_a8), iVar6 != 0)) {
            if (p->tzSet != '\0') goto LAB_0019a685;
            computeJD(p);
            sVar10 = localtimeOffset(p,local_a8,&local_ac);
            if (local_ac == 0) {
              p->iJD = p->iJD - sVar10;
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->validTZ = '\0';
              sVar11 = localtimeOffset(p,local_a8,&local_ac);
              p->iJD = p->iJD + (sVar10 - sVar11);
            }
            p->tzSet = '\x01';
          }
          goto LAB_0019a67a;
        }
        dVar3 = p->s * 1000.0 + 210866760000000.0;
        if ((dVar3 < 0.0) || (464269060800000.0 <= dVar3)) goto LAB_0019a67a;
        p->validTZ = '\0';
        p->iJD = (long)dVar3;
        p->validJD = '\x01';
        p->rawS = '\0';
        p->validYMD = '\0';
        p->validHMS = '\0';
      }
LAB_0019a685:
      uVar19 = local_70 + 1;
    } while (uVar19 != local_78);
  }
  computeJD(p);
  uVar18 = 1;
  if (p->isError == '\0') {
    uVar18 = (uint)(0x1a6401072fdff < (ulong)p->iJD);
  }
  return uVar18;
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}